

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.cpp
# Opt level: O1

string * __thiscall
bhf::StringTo<std::__cxx11::string>
          (string *__return_storage_ptr__,bhf *this,string *v,string *param_2)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)this,*(long *)(this + 8) + *(long *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string StringTo<std::string>(const std::string& v, const std::string)
{
    return v;
}